

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O3

void __thiscall wasm::LogExecution::visitModule(LogExecution *this,Module *curr)

{
  char *pcVar1;
  Function *pFVar2;
  pointer puVar3;
  HeapType type;
  undefined1 reuse;
  pointer puVar4;
  string_view sVar5;
  Name name;
  HeapType local_60;
  void *local_58;
  Type TStack_50;
  long local_48;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  type.id = DAT_010b1d88.id;
  pcVar1 = LOGGER;
  HeapType::HeapType(&local_60,(Signature)ZEXT816(2));
  local_58 = (void *)0x0;
  TStack_50.id = 0;
  local_48 = 0;
  name.super_IString.str._M_str = pcVar1;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_60.id,
             (Expression *)&local_58);
  reuse = (undefined1)local_60.id;
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  sVar5 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe67796),(bool)reuse);
  pcVar1 = (this->loggerModule).str._M_str;
  if (pcVar1 == sVar5._M_str) {
    for (puVar4 = (curr->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 != (curr->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
      if ((pcVar1 != (char *)0x0) && (pcVar1 == DAT_010b0e58)) {
        pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
             (pFVar2->super_Importable).module.super_IString.str._M_len;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
        break;
      }
    }
    if (((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str == (char *)0x0)
    {
      puVar4 = (curr->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (curr->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar4 != puVar3) {
        do {
          pFVar2 = (puVar4->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
            pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
            ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
                 (pFVar2->super_Importable).module.super_IString.str._M_len;
            ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
            if (((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str !=
                (char *)0x0) goto LAB_0093ed65;
            break;
          }
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar3);
      }
      pcVar1 = DAT_010b0e58;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
    }
  }
  else {
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (this->loggerModule).str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
  }
LAB_0093ed65:
  pcVar1 = (char *)DAT_010b1d88.id;
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = (size_t)LOGGER;
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar1;
  Module::addFunction(curr,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                           &local_38);
  if (local_38._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    // Add the import
    auto import =
      Builder::makeFunction(LOGGER, Signature(Type::i32, Type::none), {});

    if (loggerModule != "") {
      import->module = loggerModule;
    } else {
      // Import the log function from import "env" if the module
      // imports other functions from that name.
      for (auto& func : curr->functions) {
        if (func->imported() && func->module == ENV) {
          import->module = func->module;
          break;
        }
      }

      // If not, then pick the import name of the first function we find.
      if (!import->module) {
        for (auto& func : curr->functions) {
          if (func->imported()) {
            import->module = func->module;
            break;
          }
        }
      }

      // If no function was found, use ENV.
      if (!import->module) {
        import->module = ENV;
      }
    }

    import->base = LOGGER;
    curr->addFunction(std::move(import));
  }